

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_damped_harmonic_symplectic.c
# Opt level: O0

int pdot(sunrealtype t,N_Vector yvec,N_Vector ydotvec,void *user_data)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *pdVar4;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sunrealtype sVar5;
  sunrealtype sVar6;
  sunrealtype sVar7;
  sunrealtype q;
  sunrealtype p;
  sunrealtype *ydot;
  sunrealtype *y;
  
  pdVar3 = (double *)N_VGetArrayPointer(in_RDI);
  pdVar4 = (double *)N_VGetArrayPointer(in_RSI);
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  sVar5 = F(5.21765436275336e-318);
  sVar6 = omega(5.21779764179065e-318);
  sVar7 = omega(5.21787669229399e-318);
  *pdVar4 = -(sVar5 * dVar1 + sVar6 * sVar7 * dVar2);
  return 0;
}

Assistant:

int pdot(sunrealtype t, N_Vector yvec, N_Vector ydotvec, void* user_data)
{
  sunrealtype* y      = N_VGetArrayPointer(yvec);
  sunrealtype* ydot   = N_VGetArrayPointer(ydotvec);
  const sunrealtype p = y[0];
  const sunrealtype q = y[1];

  ydot[0] = -(F(t) * p + omega(t) * omega(t) * q);

  return 0;
}